

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::FormatSpec>
          (BasicWriter<char> *this,uint num_digits,FormatSpec *spec,char *prefix,uint prefix_size)

{
  byte bVar1;
  uint uVar2;
  Alignment AVar3;
  Buffer<char> *pBVar4;
  CharPtr pcVar5;
  CharPtr pcVar6;
  uint uVar7;
  size_t __len_2;
  ulong __n;
  size_t __len;
  ulong uVar8;
  char __tmp;
  ptrdiff_t _Num;
  char __tmp_1;
  AlignSpec subspec;
  AlignSpec local_3c;
  
  uVar2 = (spec->super_AlignSpec).super_WidthSpec.width_;
  uVar8 = (ulong)uVar2;
  AVar3 = (spec->super_AlignSpec).align_;
  bVar1 = (byte)(spec->super_AlignSpec).super_WidthSpec.fill_;
  if ((int)num_digits < spec->precision_) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar7 = spec->precision_ + prefix_size;
    local_3c.super_WidthSpec.fill_ = L'0';
    local_3c.align_ = ALIGN_NUMERIC;
    local_3c.super_WidthSpec.width_ = uVar7;
    if (uVar2 <= uVar7) {
      pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
      return pcVar5;
    }
    pBVar4 = this->buffer_;
    if (pBVar4->capacity_ < uVar8) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar8);
    }
    uVar8 = (ulong)(uVar2 - uVar7);
    if (AVar3 != ALIGN_LEFT) {
      pcVar5 = grow_buffer(this,uVar8);
      memset(pcVar5,(uint)bVar1,uVar8);
    }
    pcVar5 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pcVar5;
    }
    pcVar6 = grow_buffer(this,uVar8);
    memset(pcVar6,(uint)bVar1,uVar8);
    return pcVar5;
  }
  uVar7 = prefix_size + num_digits;
  if (uVar2 <= uVar7) {
    pcVar5 = grow_buffer(this,(ulong)uVar7);
    if (prefix_size != 0) {
      memmove(pcVar5,prefix,(ulong)prefix_size);
    }
    pcVar5 = pcVar5 + uVar7;
    goto LAB_0013412d;
  }
  pcVar6 = grow_buffer(this,uVar8);
  pcVar5 = pcVar6 + uVar8;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(pcVar6,prefix,(ulong)prefix_size);
      pcVar6 = pcVar6 + prefix_size;
      uVar7 = num_digits;
    }
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar8 = uVar8 - uVar7;
      __n = uVar8 >> 1;
      if (1 < uVar8) {
        memset(pcVar6,(uint)bVar1,__n);
      }
      pcVar5 = pcVar6 + __n + uVar7;
      memset(pcVar5,(uint)bVar1,uVar8 - __n);
      if (prefix_size != 0) {
        memmove(pcVar6 + __n,prefix,(ulong)prefix_size);
      }
      goto LAB_0013412d;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(pcVar6,prefix,(ulong)prefix_size);
      }
      pcVar5 = pcVar6 + uVar7;
      memset(pcVar5,(uint)bVar1,uVar8 - uVar7);
      goto LAB_0013412d;
    }
    if (prefix_size != 0) {
      memmove(pcVar5 + -(ulong)uVar7,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar5 + (-(long)pcVar6 - (ulong)uVar7) != (CharPtr)0x0) {
    memset(pcVar6,(uint)bVar1,(size_t)(pcVar5 + (-(long)pcVar6 - (ulong)uVar7)));
  }
LAB_0013412d:
  return pcVar5 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}